

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav__on_write_memory(void *pUserData,void *pDataIn,size_t bytesToWrite)

{
  ulong szNew;
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t newDataCapacity;
  void *pNewData;
  size_t bytesRemaining;
  drwav *pWav;
  drwav_allocation_callbacks *local_48;
  size_t in_stack_ffffffffffffffc8;
  
  if (in_RDI == (void *)0x0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xce7,"size_t drwav__on_write_memory(void *, const void *, size_t)");
  }
  if (*(ulong *)((long)in_RDI + 0x118) <= *(ulong *)((long)in_RDI + 0x110)) {
    szNew = *(long *)((long)in_RDI + 0x110) - *(long *)((long)in_RDI + 0x118);
    if (szNew < in_RDX) {
      if (*(long *)((long)in_RDI + 0x110) == 0) {
        local_48 = (drwav_allocation_callbacks *)0x100;
      }
      else {
        local_48 = (drwav_allocation_callbacks *)(*(long *)((long)in_RDI + 0x110) << 1);
      }
      if ((ulong)((long)local_48 - *(long *)((long)in_RDI + 0x118)) < in_RDX) {
        local_48 = (drwav_allocation_callbacks *)(*(long *)((long)in_RDI + 0x118) + in_RDX);
      }
      pvVar1 = drwav__realloc_from_callbacks(in_RDI,szNew,in_stack_ffffffffffffffc8,local_48);
      if (pvVar1 == (void *)0x0) {
        return 0;
      }
      **(undefined8 **)((long)in_RDI + 0xf8) = pvVar1;
      *(drwav_allocation_callbacks **)((long)in_RDI + 0x110) = local_48;
    }
    memcpy((void *)(**(long **)((long)in_RDI + 0xf8) + *(long *)((long)in_RDI + 0x118)),in_RSI,
           in_RDX);
    *(ulong *)((long)in_RDI + 0x118) = in_RDX + *(long *)((long)in_RDI + 0x118);
    if (*(ulong *)((long)in_RDI + 0x108) < *(ulong *)((long)in_RDI + 0x118)) {
      *(undefined8 *)((long)in_RDI + 0x108) = *(undefined8 *)((long)in_RDI + 0x118);
    }
    **(undefined8 **)((long)in_RDI + 0x100) = *(undefined8 *)((long)in_RDI + 0x108);
    return in_RDX;
  }
  __assert_fail("pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h",
                0xce8,"size_t drwav__on_write_memory(void *, const void *, size_t)");
}

Assistant:

static size_t drwav__on_write_memory(void* pUserData, const void* pDataIn, size_t bytesToWrite)
{
    drwav* pWav = (drwav*)pUserData;
    size_t bytesRemaining;

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos);

    bytesRemaining = pWav->memoryStreamWrite.dataCapacity - pWav->memoryStreamWrite.currentWritePos;
    if (bytesRemaining < bytesToWrite) {
        /* Need to reallocate. */
        void* pNewData;
        size_t newDataCapacity = (pWav->memoryStreamWrite.dataCapacity == 0) ? 256 : pWav->memoryStreamWrite.dataCapacity * 2;

        /* If doubling wasn't enough, just make it the minimum required size to write the data. */
        if ((newDataCapacity - pWav->memoryStreamWrite.currentWritePos) < bytesToWrite) {
            newDataCapacity = pWav->memoryStreamWrite.currentWritePos + bytesToWrite;
        }

        pNewData = drwav__realloc_from_callbacks(*pWav->memoryStreamWrite.ppData, newDataCapacity, pWav->memoryStreamWrite.dataCapacity, &pWav->allocationCallbacks);
        if (pNewData == NULL) {
            return 0;
        }

        *pWav->memoryStreamWrite.ppData = pNewData;
        pWav->memoryStreamWrite.dataCapacity = newDataCapacity;
    }

    DRWAV_COPY_MEMORY(((drwav_uint8*)(*pWav->memoryStreamWrite.ppData)) + pWav->memoryStreamWrite.currentWritePos, pDataIn, bytesToWrite);

    pWav->memoryStreamWrite.currentWritePos += bytesToWrite;
    if (pWav->memoryStreamWrite.dataSize < pWav->memoryStreamWrite.currentWritePos) {
        pWav->memoryStreamWrite.dataSize = pWav->memoryStreamWrite.currentWritePos;
    }

    *pWav->memoryStreamWrite.pDataSize = pWav->memoryStreamWrite.dataSize;

    return bytesToWrite;
}